

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceWithMatchExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,SequenceWithMatchExpr *this)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  uint uVar3;
  uint local_58;
  NondegeneracyCheckResult local_38;
  
  uVar3 = 0;
  if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged == true) {
    uVar3 = 0;
    if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._M_value.
        range.min == 0) {
      uVar3 = (uint)(byte)(*(int *)&(this->repetition).
                                    super__Optional_base<slang::ast::SequenceRepetition,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<slang::ast::SequenceRepetition>.
                                    _M_payload._M_value.range.max.
                                    super__Optional_base<unsigned_int,_true,_true>._M_payload == 0 &
                          (this->repetition).
                          super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>.
                          _M_payload.field2[0xc]) * 2 + 1;
    }
    local_38._4_4_ = 0;
    local_38.noMatchRange.startLoc._0_4_ = 0;
    local_38.noMatchRange.startLoc._4_4_ = 0;
    local_38.noMatchRange.endLoc._0_4_ = 0;
    local_38.noMatchRange.endLoc._4_4_ = local_38.noMatchRange.endLoc._4_4_ & 0xffffff00;
    local_58 = local_38.status.m_bits;
  }
  AssertionExpr::checkNondegeneracy(&local_38,this->expr);
  *(undefined8 *)&(__return_storage_ptr__->noMatchRange).endLoc.field_0x1 = 0;
  *(ulong *)&__return_storage_ptr__->field_0x4 = (ulong)local_58;
  *(undefined8 *)&(__return_storage_ptr__->noMatchRange).startLoc.field_0x4 = 0;
  (__return_storage_ptr__->status).m_bits = uVar3 | local_38.status.m_bits;
  if (((ulong)(__return_storage_ptr__->noMatchRange).startLoc & 0xfffffff) == 0) {
    SVar1._4_4_ = local_38.noMatchRange.startLoc._4_4_;
    SVar1._0_4_ = local_38.noMatchRange.startLoc._0_4_;
    SVar2._4_4_ = local_38.noMatchRange.endLoc._4_4_;
    SVar2._0_4_ = local_38.noMatchRange.endLoc._0_4_;
    (__return_storage_ptr__->noMatchRange).startLoc = SVar1;
    (__return_storage_ptr__->noMatchRange).endLoc = SVar2;
    __return_storage_ptr__->isAlwaysFalse = local_38.isAlwaysFalse;
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SequenceWithMatchExpr::checkNondegeneracyImpl() const {
    NondegeneracyCheckResult result;
    if (repetition)
        result = repetition->checkNondegeneracy();

    return result | expr.checkNondegeneracy();
}